

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O0

variable_access_map_t *
tchecker::variable_access(variable_access_map_t *__return_storage_ptr__,system_t *system)

{
  system_t *psVar1;
  bool bVar2;
  edge_id_t eVar3;
  loc_id_t id;
  process_id_t pVar4;
  edges_collection_const_iterator_t *peVar5;
  element_type *peVar6;
  typed_statement_t *stmt;
  const_iterator_t *pcVar7;
  element_type *peVar8;
  typed_expression_t *ptVar9;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  rVar10;
  undefined1 local_a0 [8];
  loc_const_shared_ptr_t loc;
  const_iterator_t __end1_1;
  const_iterator_t __begin1_1;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  *__range1_1;
  edge_const_shared_ptr_t edge;
  edges_collection_const_iterator_t __end1;
  edges_collection_const_iterator_t __begin1;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  local_38;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  *local_28;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  *__range1;
  system_t *local_18;
  system_t *system_local;
  variable_access_map_t *map;
  
  __range1._7_1_ = 0;
  local_18 = system;
  system_local = (system_t *)__return_storage_ptr__;
  variable_access_map_t::variable_access_map_t(__return_storage_ptr__);
  local_38 = tchecker::system::edges_t::edges
                       (&(local_18->super_system_t).super_system_t.super_edges_t);
  local_28 = &local_38;
  peVar5 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
           ::begin(local_28);
  __end1.super_const_iterator._M_current = (const_iterator)(peVar5->super_const_iterator)._M_current
  ;
  peVar5 = range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
           ::end(local_28);
  edge.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(peVar5->super_const_iterator)._M_current;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1.super_const_iterator,
                       (__normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
                        *)&edge.
                           super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
    if (!bVar2) break;
    tchecker::system::edges_collection_const_iterator_t::operator*
              ((edges_collection_const_iterator_t *)&__range1_1);
    psVar1 = local_18;
    peVar6 = std::
             __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&__range1_1);
    eVar3 = tchecker::system::edge_t::id(peVar6);
    ptVar9 = ta::system_t::guard(psVar1,eVar3);
    peVar6 = std::
             __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&__range1_1);
    pVar4 = tchecker::system::edge_t::pid(peVar6);
    add_accesses(ptVar9,pVar4,__return_storage_ptr__);
    psVar1 = local_18;
    peVar6 = std::
             __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&__range1_1);
    eVar3 = tchecker::system::edge_t::id(peVar6);
    stmt = ta::system_t::statement(psVar1,eVar3);
    peVar6 = std::
             __shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&__range1_1);
    pVar4 = tchecker::system::edge_t::pid(peVar6);
    add_accesses(stmt,pVar4,__return_storage_ptr__);
    std::shared_ptr<const_tchecker::system::edge_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::edge_t> *)&__range1_1);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<tchecker::system::edge_t>_*,_std::vector<std::shared_ptr<tchecker::system::edge_t>,_std::allocator<std::shared_ptr<tchecker::system::edge_t>_>_>_>
    ::operator++(&__end1.super_const_iterator);
  }
  rVar10 = tchecker::system::locs_t::locations
                     (&(local_18->super_system_t).super_system_t.super_locs_t);
  __begin1_1 = rVar10._begin.super_const_iterator._M_current;
  pcVar7 = range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
           ::begin((range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
                    *)&__begin1_1);
  __end1_1.super_const_iterator._M_current =
       (const_iterator)(pcVar7->super_const_iterator)._M_current;
  pcVar7 = range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
           ::end((range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
                  *)&__begin1_1);
  loc.super___shared_ptr<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pcVar7->super_const_iterator)._M_current;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1.super_const_iterator,
                       (__normal_iterator<const_std::shared_ptr<tchecker::system::loc_t>_*,_std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>
                        *)&loc.
                           super___shared_ptr<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
    if (!bVar2) break;
    tchecker::system::locs_t::const_iterator_t::operator*((const_iterator_t *)local_a0);
    psVar1 = local_18;
    peVar8 = std::
             __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a0);
    id = tchecker::system::loc_t::id(peVar8);
    ptVar9 = ta::system_t::invariant(psVar1,id);
    peVar8 = std::
             __shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_a0);
    pVar4 = tchecker::system::loc_t::pid(peVar8);
    add_accesses(ptVar9,pVar4,__return_storage_ptr__);
    std::shared_ptr<const_tchecker::system::loc_t>::~shared_ptr
              ((shared_ptr<const_tchecker::system::loc_t> *)local_a0);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<tchecker::system::loc_t>_*,_std::vector<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>_>
    ::operator++(&__end1_1.super_const_iterator);
  }
  return __return_storage_ptr__;
}

Assistant:

tchecker::variable_access_map_t variable_access(tchecker::ta::system_t const & system)
{
  tchecker::variable_access_map_t map;

  for (tchecker::system::edge_const_shared_ptr_t edge : system.edges()) {
    tchecker::add_accesses(system.guard(edge->id()), edge->pid(), map);
    tchecker::add_accesses(system.statement(edge->id()), edge->pid(), map);
  }

  for (tchecker::system::loc_const_shared_ptr_t loc : system.locations())
    tchecker::add_accesses(system.invariant(loc->id()), loc->pid(), map);

  return map;
}